

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O1

REF_STATUS ref_agents_remove(REF_AGENTS ref_agents,REF_INT id)

{
  REF_AGENT_STRUCT *pRVar1;
  int iVar2;
  REF_AGENT_STRUCT *pRVar3;
  REF_STATUS RVar4;
  
  RVar4 = 3;
  if ((-1 < id) && (id < ref_agents->max)) {
    pRVar3 = ref_agents->agent;
    if (pRVar3[(uint)id].mode != REF_AGENT_UNUSED) {
      pRVar1 = pRVar3 + (uint)id;
      if (ref_agents->last == id) {
        ref_agents->last = pRVar1->previous;
      }
      iVar2 = pRVar1->previous;
      if ((long)iVar2 != -1) {
        pRVar3[iVar2].next = pRVar1->next;
      }
      if ((long)pRVar1->next != -1) {
        pRVar3[pRVar1->next].previous = iVar2;
      }
      pRVar1->mode = REF_AGENT_UNUSED;
      pRVar3[(uint)id].previous = -1;
      pRVar3[(uint)id].next = ref_agents->blank;
      ref_agents->blank = id;
      ref_agents->n = ref_agents->n + -1;
      RVar4 = 0;
    }
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_agents_remove(REF_AGENTS ref_agents, REF_INT id) {
  if (id < 0 || ref_agents_max(ref_agents) <= id) return REF_INVALID;
  if (!ref_agent_valid(ref_agents, id)) return REF_INVALID;

  if (ref_agents->last == id)
    ref_agents->last = ref_agent_previous(ref_agents, id);

  if (REF_EMPTY != ref_agent_previous(ref_agents, id))
    ref_agent_next(ref_agents, ref_agent_previous(ref_agents, id)) =
        ref_agent_next(ref_agents, id);

  if (REF_EMPTY != ref_agent_next(ref_agents, id))
    ref_agent_previous(ref_agents, ref_agent_next(ref_agents, id)) =
        ref_agent_previous(ref_agents, id);

  ref_agent_mode(ref_agents, id) = REF_AGENT_UNUSED;
  ref_agent_previous(ref_agents, id) = REF_EMPTY;
  ref_agent_next(ref_agents, id) = ref_agents->blank;
  ref_agents->blank = id;

  ref_agents_n(ref_agents)--;

  return REF_SUCCESS;
}